

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O3

void __thiscall ON_LinearWorkflow::SetPostProcessGamma(ON_LinearWorkflow *this,float gamma)

{
  ON_InternalXMLImpl *this_00;
  ON_XMLVariant OStack_108;
  
  this_00 = &this->_impl->super_ON_InternalXMLImpl;
  if (gamma <= 0.2) {
    gamma = 0.2;
  }
  if (5.0 <= gamma) {
    gamma = 5.0;
  }
  ::ON_XMLVariant::ON_XMLVariant(&OStack_108,gamma);
  ON_InternalXMLImpl::SetParameter
            (this_00,L"render-content-manager-document/settings/rendering",L"gamma",&OStack_108);
  ::ON_XMLVariant::~ON_XMLVariant(&OStack_108);
  return;
}

Assistant:

void ON_LinearWorkflow::SetPostProcessGamma(float gamma)
{
  _impl->SetParameter(XMLPath(), ON_RDK_POST_PROCESS_GAMMA, ClampGamma(gamma));
}